

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_stack_operation.hpp
# Opt level: O2

void squall::detail::
     construct_object<std::function<void(std::function<int(std::__cxx11::string_const&)>,std::__cxx11::string_const&)>>
               (HSQUIRRELVM vm,
               function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *v)

{
  undefined8 *puVar1;
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this;
  
  puVar1 = (undefined8 *)sq_newuserdata(vm,8);
  this = (function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *)operator_new(0x20);
  std::
  function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(this,v);
  *puVar1 = this;
  sq_setreleasehook(vm,-1,construct_object<std::function<void_(std::function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                          ::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

void construct_object(HSQUIRRELVM vm, const T& v) {
    SQUserPointer p = sq_newuserdata(vm, sizeof(T*));
    *((T**)p) = new T(v);
    SQRELEASEHOOK hook = [](SQUserPointer p, SQInteger)->SQInteger {
        delete *((T**)p);
        return 0;
    };
    sq_setreleasehook(vm, -1, hook);
}